

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_uart.c
# Opt level: O0

int UartInitialize(UartConfig *config)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  UartConfig *config_local;
  
  uart_fd = open(config->device,0x902);
  if (uart_fd == -1) {
    iVar1 = LogLevelValid(0);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      LogWrite(0,"uart","UartInitialize",0x9b,"open %s failed[%s]",config,pcVar3);
    }
    config_local._4_4_ = -1;
  }
  else {
    iVar1 = _set_speed(&config->speed);
    if (iVar1 == 0) {
      iVar1 = _set_parity();
      if (iVar1 == 0) {
        ringbuf = (RingBufferHandle)RingBufferCreate(0x400);
        is_running = 1;
        _create_worker_thread();
        iVar1 = LogLevelValid(3);
        if (iVar1 != 0) {
          LogWrite(3,"uart","UartInitialize",0xad,"uart init success");
        }
        config_local._4_4_ = 0;
      }
      else {
        iVar1 = LogLevelValid(0);
        if (iVar1 != 0) {
          LogWrite(0,"uart","UartInitialize",0xa5,"set parity failed");
        }
        config_local._4_4_ = -1;
      }
    }
    else {
      iVar1 = LogLevelValid(0);
      if (iVar1 != 0) {
        LogWrite(0,"uart","UartInitialize",0xa0,"set speed failed");
      }
      config_local._4_4_ = -1;
    }
  }
  return config_local._4_4_;
}

Assistant:

int UartInitialize(UartConfig *config) {
  uart_fd = open(config->device, O_RDWR | O_NOCTTY | O_NDELAY);
  if (-1 == uart_fd) {
    LOGE(TAG, "open %s failed[%s]", config->device, strerror(errno));
    return -1;
  }

  if (0 != _set_speed(&config->speed)) {
    LOGE(TAG, "set speed failed");
    return -1;
  }

  if (0 != _set_parity()) {
    LOGE(TAG, "set parity failed");
    return -1;
  }

  ringbuf = RingBufferCreate(1024);
  is_running = 1;
  _create_worker_thread();

  LOGD(TAG, "uart init success");
  return 0;
}